

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

void __thiscall
FIX::Session::nextSequenceReset(Session *this,Message *sequenceReset,UtcTimeStamp *now)

{
  bool bVar1;
  uint uVar2;
  IntTConvertor<unsigned_long> *pIVar3;
  uint64_t uVar4;
  SEQNUM SVar5;
  unsigned_long value;
  unsigned_long value_00;
  uchar *in_R8;
  size_t in_R9;
  UInt64Field local_1e0;
  string local_188;
  string local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e8 [8];
  NewSeqNo newSeqNo;
  undefined1 local_80 [8];
  GapFillFlag gapFillFlag;
  bool isGapFill;
  UtcTimeStamp *now_local;
  Message *sequenceReset_local;
  Session *this_local;
  
  gapFillFlag.super_BoolField.super_FieldBase.m_metrics.m_checksum._3_1_ = 0;
  GapFillFlag::GapFillFlag((GapFillFlag *)local_80);
  bVar1 = FieldMap::getFieldIfSet(&sequenceReset->super_FieldMap,(FieldBase *)local_80);
  if (bVar1) {
    gapFillFlag.super_BoolField.super_FieldBase.m_metrics.m_checksum._3_1_ =
         BoolField::operator_cast_to_bool((BoolField *)local_80);
  }
  uVar2 = verify(this,(EVP_PKEY_CTX *)sequenceReset,
                 (uchar *)(ulong)(gapFillFlag.super_BoolField.super_FieldBase.m_metrics.m_checksum.
                                  _3_1_ & 1),
                 (ulong)(gapFillFlag.super_BoolField.super_FieldBase.m_metrics.m_checksum._3_1_ & 1)
                 ,in_R8,in_R9);
  if ((uVar2 & 1) == 0) {
    newSeqNo.super_SeqNumField.super_FieldBase.m_metrics.m_length = 1;
  }
  else {
    NewSeqNo::NewSeqNo((NewSeqNo *)local_e8);
    bVar1 = FieldMap::getFieldIfSet(&sequenceReset->super_FieldMap,(FieldBase *)local_e8);
    if (bVar1) {
      pIVar3 = (IntTConvertor<unsigned_long> *)getExpectedTargetNum(this);
      IntTConvertor<unsigned_long>::convert_abi_cxx11_(&local_168,pIVar3,value);
      std::operator+(&local_148,"Received SequenceReset FROM: ",&local_168);
      std::operator+(&local_128,&local_148," TO: ");
      pIVar3 = (IntTConvertor<unsigned_long> *)
               UInt64Field::operator_cast_to_unsigned_long((UInt64Field *)local_e8);
      IntTConvertor<unsigned_long>::convert_abi_cxx11_(&local_188,pIVar3,value_00);
      std::operator+(&local_108,&local_128,&local_188);
      SessionState::onEvent(&this->m_state,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_168);
      uVar4 = UInt64Field::operator_cast_to_unsigned_long((UInt64Field *)local_e8);
      SVar5 = getExpectedTargetNum(this);
      if (SVar5 < uVar4) {
        uVar4 = UInt64Field::operator_cast_to_unsigned_long((UInt64Field *)local_e8);
        MsgSeqNum::MsgSeqNum((MsgSeqNum *)&local_1e0,uVar4);
        uVar4 = UInt64Field::operator_cast_to_unsigned_long(&local_1e0);
        SessionState::setNextTargetMsgSeqNum(&this->m_state,uVar4);
        MsgSeqNum::~MsgSeqNum((MsgSeqNum *)&local_1e0);
      }
      else {
        uVar4 = UInt64Field::operator_cast_to_unsigned_long((UInt64Field *)local_e8);
        SVar5 = getExpectedTargetNum(this);
        if (uVar4 < SVar5) {
          generateReject(this,sequenceReset,5,0);
        }
      }
    }
    NewSeqNo::~NewSeqNo((NewSeqNo *)local_e8);
    newSeqNo.super_SeqNumField.super_FieldBase.m_metrics.m_length = 0;
  }
  GapFillFlag::~GapFillFlag((GapFillFlag *)local_80);
  return;
}

Assistant:

void Session::nextSequenceReset(const Message &sequenceReset, const UtcTimeStamp &now) {
  bool isGapFill = false;
  GapFillFlag gapFillFlag;
  if (sequenceReset.getFieldIfSet(gapFillFlag)) {
    isGapFill = gapFillFlag;
  }

  if (!verify(sequenceReset, isGapFill, isGapFill)) {
    return;
  }

  NewSeqNo newSeqNo;
  if (sequenceReset.getFieldIfSet(newSeqNo)) {
    m_state.onEvent(
        "Received SequenceReset FROM: " + SEQNUM_CONVERTOR::convert(getExpectedTargetNum())
        + " TO: " + SEQNUM_CONVERTOR::convert(newSeqNo));

    if (newSeqNo > getExpectedTargetNum()) {
      m_state.setNextTargetMsgSeqNum(MsgSeqNum(newSeqNo));
    } else if (newSeqNo < getExpectedTargetNum()) {
      generateReject(sequenceReset, SessionRejectReason_VALUE_IS_INCORRECT);
    }
  }
}